

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

int32_t __thiscall
icu_63::DayPeriodRules::getStartHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  int32_t iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  iVar1 = -1;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (dayPeriod == DAYPERIOD_MIDNIGHT) {
      return 0;
    }
    if (dayPeriod == DAYPERIOD_NOON) {
      return 0xc;
    }
    if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
      if (this->fDayPeriodForHour[0x16] == dayPeriod) {
        uVar3 = 0x16;
        do {
          uVar2 = uVar3;
          bVar4 = (uint)uVar2 < 2;
          if (bVar4) break;
          uVar3 = (ulong)((uint)uVar2 - 1);
        } while (this->fDayPeriodForHour[uVar3] == dayPeriod);
      }
      else {
        uVar2 = 0x17;
        bVar4 = false;
      }
    }
    else {
      uVar2 = 0;
      bVar4 = false;
      if (this->fDayPeriodForHour[0] != dayPeriod) {
        uVar2 = 0;
        do {
          uVar3 = uVar2;
          if (uVar3 == 0x17) goto LAB_002cf6d8;
          uVar2 = uVar3 + 1;
        } while (this->fDayPeriodForHour[uVar3 + 1] != dayPeriod);
        bVar4 = 0x16 < uVar3;
      }
    }
    iVar1 = (int32_t)uVar2;
    if (bVar4) {
LAB_002cf6d8:
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return -1;
    }
  }
  return iVar1;
}

Assistant:

int32_t DayPeriodRules::getStartHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. Start hour is later than end hour.
        for (int32_t i = 22; i >= 1; --i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                return (i + 1);
            }
        }
    } else {
        for (int32_t i = 0; i <= 23; ++i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return i;
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}